

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::ParseAddtlInfo_SnapProxyInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  TTD_PTR_ID *pTVar1;
  TTD_PTR_ID TVar2;
  
  pTVar1 = (TTD_PTR_ID *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  TVar2 = FileReader::ReadAddr(reader,handlerId,true);
  *pTVar1 = TVar2;
  TVar2 = FileReader::ReadAddr(reader,objectId,true);
  pTVar1[1] = TVar2;
  if (snpObject->SnapObjectTag == SnapProxyObject) {
    snpObject->AddtlSnapObjectInfo = pTVar1;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ParseAddtlInfo_SnapProxyInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapProxyInfo* proxyInfo = alloc.SlabAllocateStruct<SnapProxyInfo>();

            proxyInfo->HandlerId = reader->ReadAddr(NSTokens::Key::handlerId, true);
            proxyInfo->TargetId = reader->ReadAddr(NSTokens::Key::objectId, true);

            SnapObjectSetAddtlInfoAs<SnapProxyInfo*, SnapObjectType::SnapProxyObject>(snpObject, proxyInfo);
        }